

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_128_128_20_2(void)

{
  int iVar1;
  uint8_t ciphertext_expected [16];
  uint8_t plaintext [16];
  uint8_t key [16];
  uint8_t *in_stack_fffffffffffffff8;
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)ciphertext_expected._8_8_,
                    (uint8_t *)ciphertext_expected._0_8_,in_stack_fffffffffffffff8,(uint8_t *)0x0);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_128_128_20_2(void) {
  const uint8_t key[16]                 = {0xB5, 0xDF, 0x53, 0x7B, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t plaintext[16]           = {0xF7, 0x7D, 0xB5, 0x7B, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t ciphertext_expected[16] = {0x0E, 0x59, 0x61, 0xE9, 0x99, 0x21, 0x53, 0xB1,
                                           0x32, 0x45, 0xAF, 0x24, 0x3D, 0xD7, 0xDD, 0xC0};

  return lowmc_enc(&parameters_128_128_20, key, plaintext, ciphertext_expected);
}